

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O0

SATClause * __thiscall
SAT::SAT2FO::createConflictClause(SAT2FO *this,LiteralStack *unsatCore,InferenceRule rule)

{
  bool bVar1;
  int iVar2;
  Clause *pCVar3;
  SATClause *pSVar4;
  InferenceRule in_DL;
  Clause *foConfl;
  Literal *ul;
  ConstIterator ucit;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff58;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff60;
  Inference *this_00;
  size_t in_stack_ffffffffffffff68;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffff70;
  undefined1 local_7a [50];
  Clause *local_48;
  Literal *local_40;
  Inference *in_stack_ffffffffffffffc8;
  Stack<Kernel::Literal_*> *in_stack_ffffffffffffffd0;
  Clause *in_stack_ffffffffffffffd8;
  SAT2FO *in_stack_ffffffffffffffe0;
  
  if (createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)::negStack == '\0') {
    iVar2 = __cxa_guard_acquire(&createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)
                                 ::negStack);
    if (iVar2 != 0) {
      Lib::Stack<Kernel::Literal_*>::Stack(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&createConflictClause::negStack,
                   &__dso_handle);
      __cxa_guard_release(&createConflictClause(Lib::Stack<Kernel::Literal*>&,Kernel::InferenceRule)
                           ::negStack);
    }
  }
  Lib::Stack<Kernel::Literal_*>::reset(&createConflictClause::negStack);
  Lib::Stack<Kernel::Literal_*>::ConstIterator::ConstIterator
            ((ConstIterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = Lib::Stack<Kernel::Literal_*>::ConstRefIterator::hasNext
                      ((ConstRefIterator *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    local_40 = Lib::Stack<Kernel::Literal_*>::ConstIterator::next((ConstIterator *)0xaa2567);
    Kernel::Literal::complementaryLiteral((Literal *)in_stack_ffffffffffffff60);
    Lib::Stack<Kernel::Literal_*>::push
              (in_stack_ffffffffffffff60,(Literal *)in_stack_ffffffffffffff58);
  }
  this_00 = (Inference *)local_7a;
  Kernel::NonspecificInference0::NonspecificInference0((NonspecificInference0 *)this_00,AXIOM,in_DL)
  ;
  Kernel::Inference::Inference(this_00,(NonspecificInference0 *)in_stack_ffffffffffffff58);
  pCVar3 = Kernel::Clause::fromStack(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Kernel::Inference::~Inference((Inference *)(local_7a + 2));
  local_48 = pCVar3;
  pSVar4 = toSAT(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return pSVar4;
}

Assistant:

SATClause* SAT2FO::createConflictClause(LiteralStack& unsatCore, InferenceRule rule)
{
  static LiteralStack negStack;
  negStack.reset();
  LiteralStack::ConstIterator ucit(unsatCore);
  while(ucit.hasNext()) {
    Literal* ul = ucit.next();
    negStack.push(Literal::complementaryLiteral(ul));
  }
  Clause* foConfl = Clause::fromStack(negStack,NonspecificInference0(UnitInputType::AXIOM,rule));
  return toSAT(foConfl);
}